

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::C_Decrypt(SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pEncryptedData,
                  CK_ULONG ulEncryptedDataLen,CK_BYTE_PTR pData,CK_ULONG_PTR pulDataLen)

{
  bool bVar1;
  int iVar2;
  Session *this_00;
  SymmetricAlgorithm *pSVar3;
  undefined4 extraout_var;
  AsymmetricAlgorithm *pAVar4;
  PrivateKey *pPVar5;
  ulong uVar6;
  size_t sVar7;
  uchar *puVar8;
  CK_RV CVar9;
  ByteString data;
  ByteString encryptedData;
  ByteString local_b0;
  Type local_84;
  ByteString local_80;
  ByteString local_58;
  
  if (this->isInitialised != true) {
    return 400;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  if (pEncryptedData == (CK_BYTE_PTR)0x0 || pulDataLen == (CK_ULONG_PTR)0x0) {
    Session::resetOp(this_00);
    return 7;
  }
  iVar2 = Session::getOpType(this_00);
  if (iVar2 != 3) {
    return 0x91;
  }
  pSVar3 = Session::getSymmetricCryptoOp(this_00);
  if (pSVar3 == (SymmetricAlgorithm *)0x0) {
    pAVar4 = Session::getAsymmetricCryptoOp(this_00);
    local_84 = Session::getMechanism(this_00);
    pPVar5 = Session::getPrivateKey(this_00);
    if ((pAVar4 != (AsymmetricAlgorithm *)0x0) &&
       (bVar1 = Session::getAllowSinglePartOp(this_00), pPVar5 != (PrivateKey *)0x0 && bVar1)) {
      bVar1 = Session::getReAuthentication(this_00);
      if (bVar1) {
        Session::resetOp(this_00);
        return 0x101;
      }
      uVar6 = (**(code **)(*(long *)pPVar5 + 0x28))(pPVar5);
      if (pData == (CK_BYTE_PTR)0x0) {
        *pulDataLen = uVar6;
        return 0;
      }
      if (*pulDataLen < uVar6) {
        *pulDataLen = uVar6;
        return 0x150;
      }
      ByteString::ByteString(&local_80,pEncryptedData,ulEncryptedDataLen);
      ByteString::ByteString(&local_b0);
      iVar2 = (*pAVar4->_vptr_AsymmetricAlgorithm[0xb])
                        (pAVar4,pPVar5,&local_80,&local_b0,(ulong)local_84);
      if ((char)iVar2 == '\0') {
        CVar9 = 0x40;
        Session::resetOp(this_00);
      }
      else {
        sVar7 = ByteString::size(&local_b0);
        if (uVar6 < sVar7) {
          softHSMLog(3,"AsymDecrypt",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                     ,0xd3b,"The size of the decrypted data exceeds the size of the mechanism");
          CVar9 = 0x41;
          Session::resetOp(this_00);
        }
        else {
          sVar7 = ByteString::size(&local_b0);
          if (sVar7 != 0) {
            puVar8 = ByteString::byte_str(&local_b0);
            sVar7 = ByteString::size(&local_b0);
            memcpy(pData,puVar8,sVar7);
          }
          sVar7 = ByteString::size(&local_b0);
          *pulDataLen = sVar7;
          Session::resetOp(this_00);
          CVar9 = 0;
        }
      }
      goto LAB_001330a7;
    }
  }
  else {
    pSVar3 = Session::getSymmetricCryptoOp(this_00);
    if ((pSVar3 != (SymmetricAlgorithm *)0x0) &&
       (bVar1 = Session::getAllowSinglePartOp(this_00), bVar1)) {
      iVar2 = (*pSVar3->_vptr_SymmetricAlgorithm[0x13])(pSVar3);
      if ((((char)iVar2 != '\0') &&
          (iVar2 = (*pSVar3->_vptr_SymmetricAlgorithm[0xd])(pSVar3),
          ulEncryptedDataLen % CONCAT44(extraout_var,iVar2) != 0)) ||
         (iVar2 = (*pSVar3->_vptr_SymmetricAlgorithm[0x14])(pSVar3,ulEncryptedDataLen),
         (char)iVar2 == '\0')) {
        Session::resetOp(this_00);
        return 0x41;
      }
      if (pData == (CK_BYTE_PTR)0x0) {
        *pulDataLen = ulEncryptedDataLen;
        return 0;
      }
      if (*pulDataLen < ulEncryptedDataLen) {
        *pulDataLen = ulEncryptedDataLen;
        return 0x150;
      }
      ByteString::ByteString(&local_80,pEncryptedData,ulEncryptedDataLen);
      ByteString::ByteString(&local_b0);
      iVar2 = (*pSVar3->_vptr_SymmetricAlgorithm[6])(pSVar3,&local_80,&local_b0);
      if ((char)iVar2 == '\0') {
        CVar9 = 0x40;
        Session::resetOp(this_00);
      }
      else {
        ByteString::ByteString(&local_58);
        iVar2 = (*pSVar3->_vptr_SymmetricAlgorithm[7])(pSVar3,&local_58);
        if ((char)iVar2 == '\0') {
          CVar9 = 0x40;
          Session::resetOp(this_00);
        }
        else {
          ByteString::operator+=(&local_b0,&local_58);
          sVar7 = ByteString::size(&local_b0);
          if (ulEncryptedDataLen < sVar7) {
            ByteString::resize(&local_b0,ulEncryptedDataLen);
          }
          sVar7 = ByteString::size(&local_b0);
          if (sVar7 != 0) {
            puVar8 = ByteString::byte_str(&local_b0);
            sVar7 = ByteString::size(&local_b0);
            memcpy(pData,puVar8,sVar7);
          }
          sVar7 = ByteString::size(&local_b0);
          *pulDataLen = sVar7;
          Session::resetOp(this_00);
          CVar9 = 0;
        }
        local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
        std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                  (&local_58.byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      }
LAB_001330a7:
      local_b0._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_b0.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      local_80._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_80.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      return CVar9;
    }
  }
  Session::resetOp(this_00);
  return 0x91;
}

Assistant:

CK_RV SoftHSM::C_Decrypt(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pEncryptedData, CK_ULONG ulEncryptedDataLen, CK_BYTE_PTR pData, CK_ULONG_PTR pulDataLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	if ((pEncryptedData == NULL_PTR) || (pulDataLen == NULL_PTR))
	{
		session->resetOp();

		return CKR_ARGUMENTS_BAD;
	}

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_DECRYPT)
		return CKR_OPERATION_NOT_INITIALIZED;

	if (session->getSymmetricCryptoOp() != NULL)
		return SymDecrypt(session, pEncryptedData, ulEncryptedDataLen,
				  pData, pulDataLen);
	else
		return AsymDecrypt(session, pEncryptedData, ulEncryptedDataLen,
				   pData, pulDataLen);
}